

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O1

string * __thiscall
helics::prettyPrintString_abi_cxx11_
          (string *__return_storage_ptr__,helics *this,ActionMessage *command)

{
  uint uVar1;
  double *pdVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  char *__s;
  uint uVar6;
  ulong uVar7;
  double *pdVar8;
  double *pdVar9;
  _Alloc_hider _Var10;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  uint uVar11;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  undefined4 local_a8;
  action_t in_stack_ffffffffffffff5c;
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  string local_88;
  double local_68;
  double local_58;
  double dStack_50;
  undefined8 local_48;
  double local_38;
  
  __s = actionMessageType(in_stack_ffffffffffffff5c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_88);
  if ((__return_storage_ptr__->_M_string_length == 7) &&
     (iVar5 = bcmp((__return_storage_ptr__->_M_dataplus)._M_p,"unknown",7), iVar5 == 0)) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,' ');
    uVar1 = *(uint *)this;
    uVar3 = -uVar1;
    if (0 < (int)uVar1) {
      uVar3 = uVar1;
    }
    uVar11 = 1;
    if (9 < uVar3) {
      uVar7 = (ulong)uVar3;
      uVar4 = 4;
      do {
        uVar11 = uVar4;
        uVar6 = (uint)uVar7;
        if (uVar6 < 100) {
          uVar11 = uVar11 - 2;
          goto LAB_002e2dc2;
        }
        if (uVar6 < 1000) {
          uVar11 = uVar11 - 1;
          goto LAB_002e2dc2;
        }
        if (uVar6 < 10000) goto LAB_002e2dc2;
        uVar7 = uVar7 / 10000;
        uVar4 = uVar11 + 4;
      } while (99999 < uVar6);
      uVar11 = uVar11 + 1;
    }
LAB_002e2dc2:
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
                 (ulong)(uVar11 + -((int)uVar1 >> 0x1f)),'-');
    CLI::std::__detail::__to_chars_10_impl<unsigned_int>
              (local_88._M_dataplus._M_p + (uint)-((int)uVar1 >> 0x1f),uVar11,uVar3);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (__return_storage_ptr__,local_88._M_dataplus._M_p,local_88._M_string_length);
LAB_002e2e07:
    local_98._M_allocated_capacity = local_88.field_2._M_allocated_capacity;
    _Var10._M_p = local_88._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    iVar5 = *(int *)this;
    if (iVar5 < 0xca) {
      if (iVar5 < -0x19) {
        if (iVar5 == -0x10000028) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back(__return_storage_ptr__,':');
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append(__return_storage_ptr__,*(char **)(this + 0x90),*(size_type *)(this + 0x80));
          return __return_storage_ptr__;
        }
        if (iVar5 == -0x69) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back(__return_storage_ptr__,':');
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append(__return_storage_ptr__,*(char **)(this + 0x90),*(size_type *)(this + 0x80));
          return __return_storage_ptr__;
        }
LAB_002e2d61:
        local_a8 = *(undefined4 *)(this + 8);
        fmt_03.size_ = 1;
        fmt_03.data_ = (char *)0x8;
        args_03.field_1.values_ = in_R9.values_;
        args_03.desc_ = (unsigned_long_long)&local_a8;
        ::fmt::v11::vformat_abi_cxx11_(&local_88,(v11 *)":From {}",fmt_03,args_03);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append(__return_storage_ptr__,local_88._M_dataplus._M_p,local_88._M_string_length);
        local_98._M_allocated_capacity = local_88.field_2._M_allocated_capacity;
        _Var10._M_p = local_88._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p == &local_88.field_2) {
          return __return_storage_ptr__;
        }
        goto LAB_002e2e16;
      }
      if (iVar5 == -0x19) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back(__return_storage_ptr__,':');
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,*(char **)(this + 0x90),*(size_type *)(this + 0x80));
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,"--");
        if (((byte)this[0x1a] & 0x10) != 0) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append(__return_storage_ptr__,"error");
          return __return_storage_ptr__;
        }
        uVar1 = *(uint *)(this + 0x10);
        uVar3 = -uVar1;
        if (0 < (int)uVar1) {
          uVar3 = uVar1;
        }
        uVar11 = 1;
        if (9 < uVar3) {
          uVar7 = (ulong)uVar3;
          uVar4 = 4;
          do {
            uVar11 = uVar4;
            uVar6 = (uint)uVar7;
            if (uVar6 < 100) {
              uVar11 = uVar11 - 2;
              goto LAB_002e2e3a;
            }
            if (uVar6 < 1000) {
              uVar11 = uVar11 - 1;
              goto LAB_002e2e3a;
            }
            if (uVar6 < 10000) goto LAB_002e2e3a;
            uVar7 = uVar7 / 10000;
            uVar4 = uVar11 + 4;
          } while (99999 < uVar6);
          uVar11 = uVar11 + 1;
        }
LAB_002e2e3a:
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
                     (ulong)(uVar11 + -((int)uVar1 >> 0x1f)),'-');
        CLI::std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_88._M_dataplus._M_p + (uint)-((int)uVar1 >> 0x1f),uVar11,uVar3);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append(__return_storage_ptr__,local_88._M_dataplus._M_p,local_88._M_string_length);
        goto LAB_002e2e07;
      }
      if (iVar5 == 0x23) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back(__return_storage_ptr__,':');
        local_88.field_2._M_allocated_capacity =
             (size_type)
             ((double)(*(long *)(this + 0x20) % 1000000000) * 1e-09 +
             (double)(*(long *)(this + 0x20) / 1000000000));
        local_88._M_dataplus._M_p._0_4_ = *(undefined4 *)(this + 8);
        local_68 = (double)CONCAT44(local_68._4_4_,*(undefined4 *)(this + 0x10));
        fmt_01.size_ = 0x1a1;
        fmt_01.data_ = (char *)0x22;
        args_01.field_1.values_ = in_R9.values_;
        args_01.desc_ = (unsigned_long_long)&local_88;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)&local_a8,(v11 *)"From ({}) Granted Time({}) to ({})",fmt_01,args_01);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append(__return_storage_ptr__,(char *)CONCAT44(in_stack_ffffffffffffff5c,local_a8),
                  local_a0);
      }
      else {
        if (iVar5 != 0x34) goto LAB_002e2d61;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back(__return_storage_ptr__,':');
        local_68 = *(double *)(this + 0x80);
        local_58 = (double)(*(long *)(this + 0x20) % 1000000000) * 1e-09 +
                   (double)(*(long *)(this + 0x20) / 1000000000);
        local_88._M_dataplus._M_p._0_4_ = *(undefined4 *)(this + 8);
        local_88.field_2._M_allocated_capacity._0_4_ = *(undefined4 *)(this + 0x14);
        local_48 = CONCAT44(local_48._4_4_,*(undefined4 *)(this + 0x10));
        fmt.size_ = 0x1a411;
        fmt.data_ = (char *)0x28;
        args.field_1.values_ = in_R9.values_;
        args.desc_ = (unsigned_long_long)&local_88;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)&local_a8,(v11 *)"From ({}) handle({}) size {} at {} to {}",fmt,args);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append(__return_storage_ptr__,(char *)CONCAT44(in_stack_ffffffffffffff5c,local_a8),
                  local_a0);
      }
    }
    else {
      if (iVar5 - 0xcaU < 3) {
        return __return_storage_ptr__;
      }
      if (iVar5 == 500) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back(__return_storage_ptr__,':');
        local_88.field_2._M_allocated_capacity =
             (size_type)
             ((double)(*(long *)(this + 0x20) % 1000000000) * 1e-09 +
             (double)(*(long *)(this + 0x20) / 1000000000));
        local_68 = (double)(*(long *)(this + 0x28) % 1000000000) * 1e-09 +
                   (double)(*(long *)(this + 0x28) / 1000000000);
        local_58 = (double)(*(long *)(this + 0x30) % 1000000000) * 1e-09 +
                   (double)(*(long *)(this + 0x30) / 1000000000);
        local_88._M_dataplus._M_p._0_4_ = *(undefined4 *)(this + 8);
        local_48 = CONCAT44(local_48._4_4_,*(undefined4 *)(this + 0x10));
        fmt_02.size_ = 0x1aaa1;
        fmt_02.data_ = (char *)0x22;
        args_02.field_1.values_ = in_R9.values_;
        args_02.desc_ = (unsigned_long_long)&local_88;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)&local_a8,(v11 *)"From ({}) Time({}, {}, {}) to ({})",fmt_02,args_02);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append(__return_storage_ptr__,(char *)CONCAT44(in_stack_ffffffffffffff5c,local_a8),
                  local_a0);
      }
      else {
        if (iVar5 != 0x10000014) goto LAB_002e2d61;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back(__return_storage_ptr__,':');
        pdVar2 = *(double **)(this + 0xa0);
        pdVar9 = pdVar2 + 8;
        iVar5 = (int)((ulong)(*(long *)(this + 0xa8) - (long)pdVar2) >> 5);
        if (iVar5 < 3) {
          pdVar9 = (double *)&emptyStr_abi_cxx11_;
        }
        pdVar8 = (double *)&emptyStr_abi_cxx11_;
        if (0 < iVar5) {
          pdVar8 = pdVar2;
        }
        local_48 = *(undefined8 *)(this + 0x80);
        local_38 = (double)(*(long *)(this + 0x20) % 1000000000) * 1e-09 +
                   (double)(*(long *)(this + 0x20) / 1000000000);
        local_88._M_dataplus._M_p = (pointer)*pdVar9;
        local_88._M_string_length = (size_type)pdVar9[1];
        local_88.field_2._M_allocated_capacity._0_4_ = *(undefined4 *)(this + 8);
        local_68 = (double)CONCAT44(local_68._4_4_,*(undefined4 *)(this + 0xc));
        local_58 = *pdVar8;
        dStack_50 = pdVar8[1];
        fmt_00.size_ = 0xa4d11d;
        fmt_00.data_ = (char *)0x24;
        args_00.field_1._0_4_ = *(undefined4 *)(this + 8);
        args_00.desc_ = (unsigned_long_long)&local_88;
        args_00.field_1._4_4_ = 0;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)&local_a8,(v11 *)"From ({})({}:{}) To {} size {} at {}",fmt_00,args_00)
        ;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append(__return_storage_ptr__,(char *)CONCAT44(in_stack_ffffffffffffff5c,local_a8),
                  local_a0);
      }
    }
    _Var10._M_p = (pointer)CONCAT44(in_stack_ffffffffffffff5c,local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var10._M_p == &local_98) {
      return __return_storage_ptr__;
    }
  }
LAB_002e2e16:
  operator_delete(_Var10._M_p,local_98._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string prettyPrintString(const ActionMessage& command)
{
    std::string ret{actionMessageType(command.action())};
    if (std::string_view{ret} == std::string_view{unknownStr}) {
        ret.push_back(' ');
        ret.append(std::to_string(static_cast<int>(command.action())));
        return ret;
    }
    switch (command.action()) {
        case CMD_REG_FED:
            ret.push_back(':');
            ret.append(command.name());
            break;
        case CMD_FED_ACK:
            ret.push_back(':');
            ret.append(command.name());
            ret.append("--");
            if (checkActionFlag(command, error_flag)) {
                ret.append("error");
            } else {
                ret.append(std::to_string(command.dest_id.baseValue()));
            }
            break;
        case CMD_PUB:
            ret.push_back(':');
            ret.append(fmt::format("From ({}) handle({}) size {} at {} to {}",
                                   command.source_id.baseValue(),
                                   command.dest_handle.baseValue(),
                                   command.payload.size(),
                                   static_cast<double>(command.actionTime),
                                   command.dest_id.baseValue()));
            break;
        case CMD_REG_BROKER:
            ret.push_back(':');
            ret.append(command.name());
            break;
        case CMD_TIME_GRANT:
            ret.push_back(':');
            ret.append(fmt::format("From ({}) Granted Time({}) to ({})",
                                   command.source_id.baseValue(),
                                   static_cast<double>(command.actionTime),
                                   command.dest_id.baseValue()));
            break;
        case CMD_TIME_REQUEST:
            ret.push_back(':');
            ret.append(fmt::format("From ({}) Time({}, {}, {}) to ({})",
                                   command.source_id.baseValue(),
                                   static_cast<double>(command.actionTime),
                                   static_cast<double>(command.Te),
                                   static_cast<double>(command.Tdemin),
                                   command.dest_id.baseValue()));
            break;
        case CMD_FED_CONFIGURE_TIME:
        case CMD_FED_CONFIGURE_INT:
        case CMD_FED_CONFIGURE_FLAG:
            break;
        case CMD_SEND_MESSAGE:
            ret.push_back(':');
            ret.append(fmt::format("From ({})({}:{}) To {} size {} at {}",
                                   command.getString(origSourceStringLoc),
                                   command.source_id.baseValue(),
                                   command.source_handle.baseValue(),
                                   command.getString(targetStringLoc),
                                   command.payload.size(),
                                   static_cast<double>(command.actionTime)));
            break;
        default:
            ret.append(fmt::format(":From {}", command.source_id.baseValue()));
            break;
    }
    return ret;
}